

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

void __thiscall SDT::Stmt1::dfs(Stmt1 *this,TreeNode *treeNode,SDTNode *fa)

{
  bool bVar1;
  Noelse *pNVar2;
  reference pvVar3;
  reference pvVar4;
  Noelse *local_40 [3];
  Noelse *local_28;
  Noelse *noelse;
  SDTNode *fa_local;
  TreeNode *treeNode_local;
  Stmt1 *this_local;
  
  noelse = (Noelse *)fa;
  fa_local = (SDTNode *)treeNode;
  treeNode_local = (TreeNode *)this;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&treeNode->sons);
  if (bVar1) {
    writeLabel(this->gotoBegin);
  }
  else {
    pNVar2 = (Noelse *)operator_new(0x48);
    Noelse::Noelse(pNVar2);
    local_40[0] = pNVar2;
    local_28 = pNVar2;
    std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
              (&(this->super_SDTNode).sons,(value_type *)local_40);
    writeLabel(this->gotoBegin);
    pNVar2 = local_28;
    local_28->gotoNext = this->gotoNext;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)fa_local,1);
    pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[](&resultTree,(long)*pvVar3)
    ;
    (**(pNVar2->super_SDTNode)._vptr_SDTNode)(pNVar2,pvVar4,this);
  }
  return;
}

Assistant:

void Stmt1::dfs(TreeNode &treeNode, SDT::SDTNode *fa) {
        if (treeNode.sons.empty()){
            writeLabel(gotoBegin);
            return;
        }
        Noelse *noelse = new Noelse;
        sons.push_back(noelse);
        writeLabel(gotoBegin);
        noelse->gotoNext = gotoNext;
        noelse->dfs(SON(1));
    }